

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O3

bool __thiscall
ON_MeshFace::ComputeFaceNormal(ON_MeshFace *this,ON_3dPointListRef *vertex_list,ON_3dVector *FN)

{
  undefined8 uVar1;
  uint uVar2;
  double *pdVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  bool bVar8;
  ulong uVar9;
  ON_3dVector b;
  ON_3dVector a;
  undefined1 local_88 [16];
  double local_78;
  undefined1 local_68 [16];
  double local_58;
  ON_3dVector local_50;
  undefined1 local_38 [16];
  double local_28;
  
  uVar2 = this->vi[2];
  dVar5 = -1.23432101234321e+308;
  dVar7 = -1.23432101234321e+308;
  local_78 = -1.23432101234321e+308;
  dVar4 = dVar5;
  dVar6 = dVar7;
  local_58 = local_78;
  if (uVar2 < vertex_list->m_point_count && -1 < (int)uVar2) {
    pdVar3 = vertex_list->m_dP;
    if (pdVar3 == (double *)0x0) {
      uVar9 = (ulong)(uVar2 * vertex_list->m_point_stride);
      uVar1 = *(undefined8 *)(vertex_list->m_fP + uVar9);
      dVar4 = (double)(float)uVar1;
      dVar6 = (double)(float)((ulong)uVar1 >> 0x20);
      local_58 = (double)vertex_list->m_fP[uVar9 + 2];
    }
    else {
      uVar9 = (ulong)(uVar2 * vertex_list->m_point_stride);
      dVar4 = pdVar3[uVar9];
      dVar6 = (pdVar3 + uVar9)[1];
      local_58 = pdVar3[uVar9 + 2];
    }
  }
  local_68._8_4_ = SUB84(dVar6,0);
  local_68._0_8_ = dVar4;
  local_68._12_4_ = (int)((ulong)dVar6 >> 0x20);
  uVar2 = this->vi[0];
  if (uVar2 < vertex_list->m_point_count && -1 < (int)uVar2) {
    pdVar3 = vertex_list->m_dP;
    if (pdVar3 == (double *)0x0) {
      uVar9 = (ulong)(uVar2 * vertex_list->m_point_stride);
      uVar1 = *(undefined8 *)(vertex_list->m_fP + uVar9);
      dVar5 = (double)(float)uVar1;
      dVar7 = (double)(float)((ulong)uVar1 >> 0x20);
      local_78 = (double)vertex_list->m_fP[uVar9 + 2];
    }
    else {
      uVar9 = (ulong)(uVar2 * vertex_list->m_point_stride);
      dVar5 = pdVar3[uVar9];
      dVar7 = (pdVar3 + uVar9)[1];
      local_78 = pdVar3[uVar9 + 2];
    }
  }
  local_88._8_4_ = SUB84(dVar7,0);
  local_88._0_8_ = dVar5;
  local_88._12_4_ = (int)((ulong)dVar7 >> 0x20);
  ON_3dPoint::operator-(&local_50,(ON_3dPoint *)local_68,(ON_3dPoint *)local_88);
  uVar2 = this->vi[3];
  local_28 = -1.23432101234321e+308;
  local_78 = -1.23432101234321e+308;
  dVar6 = -1.23432101234321e+308;
  dVar7 = -1.23432101234321e+308;
  dVar4 = dVar6;
  dVar5 = dVar7;
  if (uVar2 < vertex_list->m_point_count && -1 < (int)uVar2) {
    pdVar3 = vertex_list->m_dP;
    if (pdVar3 == (double *)0x0) {
      uVar9 = (ulong)(uVar2 * vertex_list->m_point_stride);
      uVar1 = *(undefined8 *)(vertex_list->m_fP + uVar9);
      dVar4 = (double)(float)uVar1;
      dVar5 = (double)(float)((ulong)uVar1 >> 0x20);
      local_78 = (double)vertex_list->m_fP[uVar9 + 2];
    }
    else {
      uVar9 = (ulong)(uVar2 * vertex_list->m_point_stride);
      dVar4 = pdVar3[uVar9];
      dVar5 = (pdVar3 + uVar9)[1];
      local_78 = pdVar3[uVar9 + 2];
    }
  }
  local_88._8_4_ = SUB84(dVar5,0);
  local_88._0_8_ = dVar4;
  local_88._12_4_ = (int)((ulong)dVar5 >> 0x20);
  uVar2 = this->vi[1];
  if (uVar2 < vertex_list->m_point_count && -1 < (int)uVar2) {
    pdVar3 = vertex_list->m_dP;
    if (pdVar3 == (double *)0x0) {
      uVar9 = (ulong)(uVar2 * vertex_list->m_point_stride);
      uVar1 = *(undefined8 *)(vertex_list->m_fP + uVar9);
      dVar6 = (double)(float)uVar1;
      dVar7 = (double)(float)((ulong)uVar1 >> 0x20);
      local_28 = (double)vertex_list->m_fP[uVar9 + 2];
    }
    else {
      uVar9 = (ulong)(uVar2 * vertex_list->m_point_stride);
      dVar6 = pdVar3[uVar9];
      dVar7 = (pdVar3 + uVar9)[1];
      local_28 = pdVar3[uVar9 + 2];
    }
  }
  local_38._8_4_ = SUB84(dVar7,0);
  local_38._0_8_ = dVar6;
  local_38._12_4_ = (int)((ulong)dVar7 >> 0x20);
  ON_3dPoint::operator-((ON_3dVector *)local_68,(ON_3dPoint *)local_88,(ON_3dPoint *)local_38);
  ON_CrossProduct((ON_3dVector *)local_88,&local_50,(ON_3dVector *)local_68);
  FN->z = local_78;
  FN->x = (double)local_88._0_8_;
  FN->y = (double)local_88._8_8_;
  bVar8 = ON_3dVector::Unitize(FN);
  if (!bVar8) {
    FN->z = ON_3dVector::ZeroVector.z;
    dVar4 = ON_3dVector::ZeroVector.y;
    FN->x = ON_3dVector::ZeroVector.x;
    FN->y = dVar4;
  }
  return bVar8;
}

Assistant:

bool ON_MeshFace::ComputeFaceNormal( const class ON_3dPointListRef& vertex_list, ON_3dVector& FN ) const
{
  ON_3dVector a = vertex_list[vi[2]] - vertex_list[vi[0]];
  ON_3dVector b = vertex_list[vi[3]] - vertex_list[vi[1]];
  FN = ON_CrossProduct( a, b ); // works for triangles, quads, and nonplanar quads
  if ( FN.Unitize() )
    return true;

  FN = ON_3dVector::ZeroVector;
  return false;
}